

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O2

bool BlockStream_Read(TBlockStream *pStream,ULONGLONG *pByteOffset,void *pvBuffer,
                     DWORD dwBytesToRead)

{
  ULONGLONG *pUVar1;
  ulong uVar2;
  uint uVar3;
  BLOCK_READ p_Var4;
  BLOCK_CHECK p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  LPBYTE __ptr;
  int iVar10;
  ulong __n;
  ulong uVar11;
  DWORD DVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  ulong local_80;
  LPBYTE local_60;
  
  p_Var4 = (pStream->super_TFileStream).BlockRead;
  if (p_Var4 == (BLOCK_READ)0x0) {
    __assert_fail("pStream->BlockRead != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                  ,0x34f,"bool BlockStream_Read(TBlockStream *, ULONGLONG *, void *, DWORD)");
  }
  if (dwBytesToRead == 0) {
    return true;
  }
  pUVar1 = &(pStream->super_TFileStream).StreamPos;
  if (pByteOffset == (ULONGLONG *)0x0) {
    pByteOffset = pUVar1;
  }
  uVar17 = *pByteOffset;
  __n = (ulong)dwBytesToRead;
  uVar2 = uVar17 + __n;
  if ((pStream->super_TFileStream).StreamSize < uVar2) {
    DVar12 = 0x3ea;
LAB_0010e96c:
    SetLastError(DVar12);
    return false;
  }
  uVar3 = pStream->BlockSize;
  uVar11 = (ulong)uVar3;
  if ((uVar3 & uVar3 - 1) != 0) {
    __assert_fail("(BlockSize & (BlockSize - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                  ,0x364,"bool BlockStream_Read(TBlockStream *, ULONGLONG *, void *, DWORD)");
  }
  uVar16 = -uVar11 & uVar17;
  local_80 = uVar2 - uVar16;
  __ptr = (LPBYTE)malloc((ulong)((int)((local_80 + (uVar3 - 1)) / uVar11) * uVar3));
  if (__ptr == (LPBYTE)0x0) {
    DVar12 = 0xc;
    goto LAB_0010e96c;
  }
  uVar13 = uVar3 - 1 & (uint)uVar17;
  if (pStream->IsComplete != 0) {
    bVar6 = (*p_Var4)(&pStream->super_TFileStream,uVar16,uVar2,__ptr,(DWORD)local_80,true);
    if (bVar6) {
      memcpy(pvBuffer,__ptr + uVar13,__n);
      *pUVar1 = uVar2;
      bVar7 = true;
    }
    else {
      SetLastError(0x3ee);
      bVar7 = false;
    }
    goto LAB_0010ebbb;
  }
  p_Var5 = (pStream->super_TFileStream).BlockCheck;
  if (p_Var5 == (BLOCK_CHECK)0x0) {
    __assert_fail("pStream->BlockCheck != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                  ,0x374,"bool BlockStream_Read(TBlockStream *, ULONGLONG *, void *, DWORD)");
  }
  bVar7 = (*p_Var5)(&pStream->super_TFileStream,uVar16);
  iVar10 = -(int)uVar16;
  bVar6 = false;
  uVar17 = uVar16;
  local_60 = __ptr;
  while( true ) {
    iVar15 = (int)uVar17;
    iVar14 = (int)uVar16;
    DVar12 = (DWORD)local_80;
    if (uVar2 <= uVar17) break;
    bVar8 = (*(pStream->super_TFileStream).BlockCheck)(&pStream->super_TFileStream,uVar17);
    if (bVar8 != bVar7) {
      if ((((pStream->super_TFileStream).pMaster != (TFileStream *)0x0) &&
          (pStream->pfnCallback != (STREAM_DOWNLOAD_CALLBACK)0x0)) && (bVar7 == false)) {
        (*pStream->pfnCallback)(pStream->UserData,uVar16,iVar15 - iVar14);
        bVar6 = true;
      }
      if (uVar17 <= uVar16) {
        __assert_fail("BlockOffset > BlockOffset0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                      ,0x388,"bool BlockStream_Read(TBlockStream *, ULONGLONG *, void *, DWORD)");
      }
      bVar9 = (*(pStream->super_TFileStream).BlockRead)
                        (&pStream->super_TFileStream,uVar16,uVar17,local_60,DVar12,bVar7);
      if (!bVar9) break;
      local_60 = local_60 + (uint)(iVar15 - iVar14);
      local_80 = (ulong)(DVar12 + iVar14 + iVar10);
      uVar16 = uVar17;
      bVar7 = bVar8;
    }
    uVar17 = uVar17 + uVar11;
    iVar10 = iVar10 - uVar3;
  }
  if (uVar16 < uVar17) {
    if ((((pStream->super_TFileStream).pMaster != (TFileStream *)0x0) &&
        (pStream->pfnCallback != (STREAM_DOWNLOAD_CALLBACK)0x0)) && (bVar7 == false)) {
      (*pStream->pfnCallback)(pStream->UserData,uVar16,iVar15 - iVar14);
      bVar6 = true;
    }
    uVar11 = (pStream->super_TFileStream).StreamSize;
    if (uVar17 < uVar11) {
      uVar11 = uVar17;
    }
    bVar7 = (*(pStream->super_TFileStream).BlockRead)
                      (&pStream->super_TFileStream,uVar16,uVar11,local_60,DVar12,bVar7);
    if (bVar7) goto LAB_0010eb7b;
LAB_0010eb39:
    SetLastError(0x3ee);
    bVar8 = false;
    bVar7 = false;
  }
  else {
    if (uVar17 < uVar2) goto LAB_0010eb39;
LAB_0010eb7b:
    memcpy(pvBuffer,__ptr + uVar13,__n);
    *pUVar1 = uVar2;
    bVar8 = true;
    bVar7 = true;
  }
  if (bVar6) {
    (*pStream->pfnCallback)(pStream->UserData,0,0);
    bVar7 = bVar8;
  }
LAB_0010ebbb:
  free(__ptr);
  return bVar7;
}

Assistant:

static bool BlockStream_Read(
    TBlockStream * pStream,                 // Pointer to an open stream
    ULONGLONG * pByteOffset,                // Pointer to file byte offset. If NULL, it reads from the current position
    void * pvBuffer,                        // Pointer to data to be read
    DWORD dwBytesToRead)                    // Number of bytes to read from the file
{
    ULONGLONG BlockOffset0;
    ULONGLONG BlockOffset;
    ULONGLONG ByteOffset;
    ULONGLONG EndOffset;
    LPBYTE TransferBuffer;
    LPBYTE BlockBuffer;
    DWORD BlockBufferOffset;                // Offset of the desired data in the block buffer
    DWORD BytesNeeded;                      // Number of bytes that really need to be read
    DWORD BlockSize = pStream->BlockSize;
    DWORD BlockCount;
    bool bPrevBlockAvailable;
    bool bCallbackCalled = false;
    bool bBlockAvailable;
    bool bResult = true;

    // The base block read function must be present
    assert(pStream->BlockRead != NULL);

    // NOP reading of zero bytes
    if(dwBytesToRead == 0)
        return true;

    // Get the current position in the stream
    ByteOffset = (pByteOffset != NULL) ? pByteOffset[0] : pStream->StreamPos;
    EndOffset = ByteOffset + dwBytesToRead;
    if(EndOffset > pStream->StreamSize)
    {
        SetLastError(ERROR_HANDLE_EOF);
        return false;
    }

    // Calculate the block parameters
    BlockOffset0 = BlockOffset = ByteOffset & ~((ULONGLONG)BlockSize - 1);
    BlockCount  = (DWORD)(((EndOffset - BlockOffset) + (BlockSize - 1)) / BlockSize);
    BytesNeeded = (DWORD)(EndOffset - BlockOffset);

    // Remember where we have our data
    assert((BlockSize & (BlockSize - 1)) == 0);
    BlockBufferOffset = (DWORD)(ByteOffset & (BlockSize - 1));

    // Allocate buffer for reading blocks
    TransferBuffer = BlockBuffer = CASC_ALLOC(BYTE, (BlockCount * BlockSize));
    if(TransferBuffer == NULL)
    {
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        return false;
    }

    // If all blocks are available, just read all blocks at once
    if(pStream->IsComplete == 0)
    {
        // Now parse the blocks and send the block read request
        // to all blocks with the same availability
        assert(pStream->BlockCheck != NULL);
        bPrevBlockAvailable = pStream->BlockCheck(pStream, BlockOffset);

        // Loop as long as we have something to read
        while(BlockOffset < EndOffset)
        {
            // Determine availability of the next block
            bBlockAvailable = pStream->BlockCheck(pStream, BlockOffset);

            // If the availability has changed, read all blocks up to this one
            if(bBlockAvailable != bPrevBlockAvailable)
            {
                // Call the file stream callback, if the block is not available
                if(pStream->pMaster && pStream->pfnCallback && bPrevBlockAvailable == false)
                {
                    pStream->pfnCallback(pStream->UserData, BlockOffset0, (DWORD)(BlockOffset - BlockOffset0));
                    bCallbackCalled = true;
                }

                // Load the continuous blocks with the same availability
                assert(BlockOffset > BlockOffset0);
                bResult = pStream->BlockRead(pStream, BlockOffset0, BlockOffset, BlockBuffer, BytesNeeded, bPrevBlockAvailable);
                if(!bResult)
                    break;

                // Move the block offset
                BlockBuffer += (DWORD)(BlockOffset - BlockOffset0);
                BytesNeeded -= (DWORD)(BlockOffset - BlockOffset0);
                bPrevBlockAvailable = bBlockAvailable;
                BlockOffset0 = BlockOffset;
            }

            // Move to the block offset in the stream
            BlockOffset += BlockSize;
        }

        // If there is a block(s) remaining to be read, do it
        if(BlockOffset > BlockOffset0)
        {
            // Call the file stream callback, if the block is not available
            if(pStream->pMaster && pStream->pfnCallback && bPrevBlockAvailable == false)
            {
                pStream->pfnCallback(pStream->UserData, BlockOffset0, (DWORD)(BlockOffset - BlockOffset0));
                bCallbackCalled = true;
            }

            // Read the complete blocks from the file
            if(BlockOffset > pStream->StreamSize)
                BlockOffset = pStream->StreamSize;
            bResult = pStream->BlockRead(pStream, BlockOffset0, BlockOffset, BlockBuffer, BytesNeeded, bPrevBlockAvailable);
        }
    }
    else
    {
        // Read the complete blocks from the file
        if(EndOffset > pStream->StreamSize)
            EndOffset = pStream->StreamSize;
        bResult = pStream->BlockRead(pStream, BlockOffset, EndOffset, BlockBuffer, BytesNeeded, true);
    }

    // Now copy the data to the user buffer
    if(bResult)
    {
        memcpy(pvBuffer, TransferBuffer + BlockBufferOffset, dwBytesToRead);
        pStream->StreamPos = ByteOffset + dwBytesToRead;
    }
    else
    {
        // If the block read failed, set the last error
        SetLastError(ERROR_FILE_INCOMPLETE);
    }

    // Call the callback to indicate we are done
    if(bCallbackCalled)
        pStream->pfnCallback(pStream->UserData, 0, 0);

    // Free the block buffer and return
    CASC_FREE(TransferBuffer);
    return bResult;
}